

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O1

Vec_Ptr_t * Bac_NtkTransformToPtrBoxes(Bac_Ntk_t *p)

{
  byte bVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  
  iVar8 = (p->vType).nSize;
  if ((long)iVar8 < 1) {
    iVar7 = 0;
  }
  else {
    lVar6 = 0;
    iVar7 = 0;
    do {
      bVar1 = (p->vType).pArray[lVar6];
      if ((char)bVar1 < '\0') {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      iVar7 = iVar7 + (uint)(bVar1 < 10);
      lVar6 = lVar6 + 1;
    } while (iVar8 != lVar6);
  }
  uVar9 = iVar8 - iVar7;
  if ((int)uVar9 < 0) {
    __assert_fail("nCap >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                  ,99,"Vec_Ptr_t *Vec_PtrAllocExact(int)");
  }
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nSize = 0;
  pVVar3->nCap = uVar9;
  if (iVar8 == iVar7) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((ulong)uVar9 << 3);
  }
  pVVar3->pArray = ppvVar5;
  if (0 < (p->vType).nSize) {
    lVar6 = 0;
    do {
      if (0xffffffbb < ((byte)(p->vType).pArray[lVar6] >> 1) - 0x49) {
        pVVar4 = Bac_NtkTransformToPtrBox(p,(int)lVar6);
        uVar9 = pVVar3->nSize;
        uVar2 = pVVar3->nCap;
        if (uVar9 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar3->pArray,0x80);
            }
            iVar8 = 0x10;
          }
          else {
            iVar8 = uVar2 * 2;
            if (iVar8 <= (int)uVar2) goto LAB_00394bb8;
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar3->pArray,(ulong)uVar2 << 4);
            }
          }
          pVVar3->pArray = ppvVar5;
          pVVar3->nCap = iVar8;
        }
LAB_00394bb8:
        pVVar3->nSize = uVar9 + 1;
        pVVar3->pArray[(int)uVar9] = pVVar4;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (p->vType).nSize);
  }
  if (pVVar3->nSize != pVVar3->nCap) {
    __assert_fail("Vec_PtrSize(vArray) == Vec_PtrCap(vArray)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0x6b,"int Ptr_CheckArray(Vec_Ptr_t *)");
  }
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Bac_NtkTransformToPtrBoxes( Bac_Ntk_t * p )
{
    int iBox;
    Vec_Ptr_t * vBoxes = Vec_PtrAllocExact( Bac_NtkBoxNum(p) );
    Bac_NtkForEachBox( p, iBox )
        Vec_PtrPush( vBoxes, Bac_NtkTransformToPtrBox(p, iBox) );
    assert( Ptr_CheckArray(vBoxes) );
    return vBoxes;
}